

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

double __thiscall FeeFilterRounder::round(FeeFilterRounder *this,double __x)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  uint64_t uVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  long in_RSI;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var5 = (this->m_fee_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->m_fee_set)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = &p_Var1->_M_header;
  if (p_Var5 != (_Base_ptr)0x0) {
    __x = (double)in_RSI;
    do {
      bVar2 = __x != *(double *)(p_Var5 + 1);
      bVar3 = *(double *)(p_Var5 + 1) <= __x;
      if (!bVar3 || !bVar2) {
        p_Var6 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[bVar3 && bVar2];
    } while (p_Var5 != (_Base_ptr)0x0);
  }
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    if (p_Var6 == (this->m_fee_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
    goto LAB_0099c8d5;
    local_28._M_device = &(this->m_insecure_rand_mutex).super_mutex;
    local_28._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_28);
    uVar4 = RandomMixin<FastRandomContext>::randbits<32>
                      (&this->insecure_rand->super_RandomMixin<FastRandomContext>);
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
    __x = extraout_XMM0_Qa;
    if ((uint)((int)uVar4 * -0x55555555) < 0x55555556) goto LAB_0099c8d5;
  }
  __x = (double)std::_Rb_tree_decrement((_Rb_tree_node_base *)p_Var6);
LAB_0099c8d5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __x;
  }
  __stack_chk_fail();
}

Assistant:

CAmount FeeFilterRounder::round(CAmount currentMinFee)
{
    AssertLockNotHeld(m_insecure_rand_mutex);
    std::set<double>::iterator it = m_fee_set.lower_bound(currentMinFee);
    if (it == m_fee_set.end() ||
        (it != m_fee_set.begin() &&
         WITH_LOCK(m_insecure_rand_mutex, return insecure_rand.rand32()) % 3 != 0)) {
        --it;
    }
    return static_cast<CAmount>(*it);
}